

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O1

uint64_t bloaty::ReadEncodedPointer
                   (uint8_t encoding,bool is_64bit,string_view *data,char *data_base,RangeSink *sink
                   )

{
  uint64_t *puVar1;
  ulong uVar2;
  size_t sVar3;
  uint64_t uVar4;
  Nonnull<char_*> pcVar5;
  bool is_signed;
  RangeSink *pRVar6;
  uint64_t address;
  string_view sVar7;
  string_view format;
  string_view format_00;
  string local_80;
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  if (0xc < (encoding & 0xf)) {
switchD_001a4d1b_caseD_5:
    pcVar5 = absl::numbers_internal::FastIntToBuffer((uint)(encoding & 0xf),local_50);
    local_60 = (long)pcVar5 - (long)local_50;
    format_00._M_str = (char *)&local_60;
    format_00._M_len = (size_t)"Unexpected eh_frame format value: $0";
    local_58 = local_50;
    absl::Substitute_abi_cxx11_(&local_80,(absl *)0x24,format_00,(Arg *)sink);
    Throw(local_80._M_dataplus._M_p,0x44);
  }
  puVar1 = (uint64_t *)data->_M_str;
  pRVar6 = sink;
  switch(encoding & 0xf) {
  case 0:
    uVar2 = data->_M_len;
    if (is_64bit) goto LAB_001a4d20;
    break;
  case 1:
    is_signed = false;
    goto LAB_001a4dba;
  case 2:
    uVar2 = data->_M_len;
    if (uVar2 < 2) goto LAB_001a4e40;
    address = (uint64_t)(ushort)*puVar1;
    goto LAB_001a4d7b;
  case 3:
    uVar2 = data->_M_len;
    break;
  case 4:
  case 0xc:
    uVar2 = data->_M_len;
LAB_001a4d20:
    if (uVar2 < 8) goto LAB_001a4e40;
    address = *puVar1;
    data->_M_str = (char *)(puVar1 + 1);
    sVar3 = uVar2 - 8;
    goto LAB_001a4db0;
  default:
    goto switchD_001a4d1b_caseD_5;
  case 9:
    is_signed = true;
LAB_001a4dba:
    address = dwarf::ReadLEB128Internal(is_signed,data);
    goto LAB_001a4dc5;
  case 10:
    uVar2 = data->_M_len;
    if (uVar2 < 2) goto LAB_001a4e40;
    address = (uint64_t)(short)(ushort)*puVar1;
LAB_001a4d7b:
    data->_M_str = (char *)((long)puVar1 + 2);
    sVar3 = uVar2 - 2;
    goto LAB_001a4db0;
  case 0xb:
    uVar2 = data->_M_len;
    if (uVar2 < 4) goto LAB_001a4e40;
    address = (uint64_t)(int)(uint)*puVar1;
    goto LAB_001a4da3;
  }
  if (uVar2 < 4) goto LAB_001a4e40;
  address = (uint64_t)(uint)*puVar1;
LAB_001a4da3:
  data->_M_str = (char *)((long)puVar1 + 4);
  sVar3 = uVar2 - 4;
LAB_001a4db0:
  data->_M_len = sVar3;
LAB_001a4dc5:
  switch((encoding & 0x70) - 0x10 >> 4) {
  case 0:
    data_base = (char *)puVar1;
    break;
  case 1:
  case 3:
  case 4:
    pcVar5 = absl::numbers_internal::FastIntToBuffer((uint)(encoding & 0x70),local_50);
    local_60 = (long)pcVar5 - (long)local_50;
    format._M_str = (char *)&local_60;
    format._M_len = (size_t)"Unimplemented eh_frame application value: $0";
    local_58 = local_50;
    absl::Substitute_abi_cxx11_(&local_80,(absl *)0x2c,format,(Arg *)pRVar6);
    Throw(local_80._M_dataplus._M_p,0x58);
  case 2:
    if (data_base == (char *)0x0) {
      Throw("datarel requested but no data_base provided",0x51);
    }
    break;
  default:
    goto switchD_001a4de5_default;
  }
  uVar4 = RangeSink::TranslateFileToVM(sink,data_base);
  address = address + uVar4;
switchD_001a4de5_default:
  if ((char)encoding < '\0') {
    sVar7 = RangeSink::TranslateVMToFile(sink,address);
    if (is_64bit) {
      if (sVar7._M_len < 8) {
LAB_001a4e40:
        Throw("premature EOF reading fixed-length data",0x8d);
      }
      address = *(uint64_t *)sVar7._M_str;
    }
    else {
      if (sVar7._M_len < 4) goto LAB_001a4e40;
      address = (uint64_t)(uint)*(uint64_t *)sVar7._M_str;
    }
  }
  return address;
}

Assistant:

uint64_t ReadEncodedPointer(uint8_t encoding, bool is_64bit, string_view* data,
                            const char* data_base, RangeSink* sink) {
  uint64_t value;
  const char* ptr = data->data();
  uint8_t format = encoding & DW_EH_PE_FORMAT_MASK;

  switch (format) {
    case DW_EH_PE_omit:
      return 0;
    case DW_EH_PE_absptr:
      if (is_64bit) {
        value = ReadFixed<uint64_t>(data);
      } else {
        value = ReadFixed<uint32_t>(data);
      }
      break;
    case DW_EH_PE_uleb128:
      value = dwarf::ReadLEB128<uint64_t>(data);
      break;
    case DW_EH_PE_udata2:
      value = ReadFixed<uint16_t>(data);
      break;
    case DW_EH_PE_udata4:
      value = ReadFixed<uint32_t>(data);
      break;
    case DW_EH_PE_udata8:
      value = ReadFixed<uint64_t>(data);
      break;
    case DW_EH_PE_sleb128:
      value = dwarf::ReadLEB128<int64_t>(data);
      break;
    case DW_EH_PE_sdata2:
      value = ReadFixed<int16_t>(data);
      break;
    case DW_EH_PE_sdata4:
      value = ReadFixed<int32_t>(data);
      break;
    case DW_EH_PE_sdata8:
      value = ReadFixed<int64_t>(data);
      break;
    default:
      THROWF("Unexpected eh_frame format value: $0", format);
  }

  uint8_t application = encoding & DW_EH_PE_APPLICATION_MASK;

  switch (application) {
    case 0:
      break;
    case DW_EH_PE_pcrel:
      value += sink->TranslateFileToVM(ptr);
      break;
    case DW_EH_PE_datarel:
      if (data_base == nullptr) {
        THROW("datarel requested but no data_base provided");
      }
      value += sink->TranslateFileToVM(data_base);
      break;
    case DW_EH_PE_textrel:
    case DW_EH_PE_funcrel:
    case DW_EH_PE_aligned:
      THROWF("Unimplemented eh_frame application value: $0", application);
  }

  if (encoding & DW_EH_PE_indirect) {
    string_view location = sink->TranslateVMToFile(value);
    if (is_64bit) {
      value = ReadFixed<uint64_t>(&location);
    } else {
      value = ReadFixed<uint32_t>(&location);
    }
  }

  return value;
}